

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c9fea::AddInteractionsFromBPM_PolyMap_Test::TestBody
          (AddInteractionsFromBPM_PolyMap_Test *this)

{
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_178;
  BinaryPolynomialModel<unsigned_int,_double> bpm;
  
  local_178._M_buckets = &local_178._M_single_bucket;
  local_178._M_bucket_count = 1;
  local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_178._M_element_count = 0;
  local_178._M_rehash_policy._M_max_load_factor = 1.0;
  local_178._M_rehash_policy._4_4_ = 0;
  local_178._M_rehash_policy._M_next_resize = 0;
  local_178._M_single_bucket = (__node_base_ptr)0x0;
  cimod::BinaryPolynomialModel<unsigned_int,_double>::BinaryPolynomialModel
            (&bpm,(Polynomial<unsigned_int,_double> *)&local_178,SPIN);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_178);
  GeneratePolynomialUINT();
  cimod::BinaryPolynomialModel<unsigned_int,_double>::AddInteractionsFrom
            (&bpm,(Polynomial<unsigned_int,_double> *)&local_178,NONE);
  std::
  _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_178);
  StateTestBPMUINT(&bpm);
  cimod::BinaryPolynomialModel<unsigned_int,_double>::~BinaryPolynomialModel(&bpm);
  return;
}

Assistant:

void StateTestBPMEmpty(const BinaryPolynomialModel<IndexType, double> &bpm) {
   
   EXPECT_EQ(bpm.GetNumVariables(), 0);

   EXPECT_DOUBLE_EQ(bpm.GetOffset(), 0.0);
   
   EXPECT_EQ(bpm.GetNumInteractions(), 0);
   
   EXPECT_EQ(bpm.GetDegree(), 0);
      
   //Polynomial
   EXPECT_EQ(bpm.GetPolynomial().size(), 0);
   
   //variables_to_integers
   EXPECT_EQ(bpm.GetVariablesToIntegers().size(), 0);
   
   //Polynomial Key
   EXPECT_EQ(bpm.GetKeyList().size(), 0);
   
   //Polynomial Val
   EXPECT_EQ(bpm.GetValueList().size(), 0);

   //sorted_variables
   auto sorted_variables = bpm.GetSortedVariables();
   EXPECT_EQ(sorted_variables.size(), 0);
   
   //variables
   EXPECT_EQ(bpm.GetVariables().size(), 0);

}